

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.hpp
# Opt level: O0

format_segment<char> *
fmt::impl::parse_format_segment<char>
          (format_segment<char> *__return_storage_ptr__,char *format,integer arg_index)

{
  bool bVar1;
  _Ios_Fmtflags _Var2;
  long lVar3;
  long local_50;
  integer index_2;
  streamsize precision;
  integer index_1;
  streamsize width;
  integer index;
  char *begin;
  integer iStack_18;
  char ch;
  integer arg_index_local;
  char *format_local;
  
  iStack_18 = arg_index;
  arg_index_local = (integer)format;
  format_segment<char>::format_segment(__return_storage_ptr__);
  if (arg_index_local != 0) {
    __return_storage_ptr__->beginp = (char *)arg_index_local;
    begin._7_1_ = *(char *)arg_index_local;
    while (begin._7_1_ != '\0' && begin._7_1_ != '%') {
      begin._7_1_ = *(char *)(arg_index_local + 1);
      arg_index_local = arg_index_local + 1;
    }
    __return_storage_ptr__->endp = (char *)arg_index_local;
    if (begin._7_1_ == '\0') {
      __return_storage_ptr__->valid = true;
    }
    else {
      lVar3 = arg_index_local + 1;
      begin._7_1_ = *(char *)(arg_index_local + 1);
      if (begin._7_1_ != '\0') {
        if (begin._7_1_ == '%') {
          __return_storage_ptr__->valid = true;
          __return_storage_ptr__->endp = __return_storage_ptr__->endp + 1;
          __return_storage_ptr__->nextp = (char *)(arg_index_local + 2);
        }
        else {
          arg_index_local = lVar3;
          if (('0' < begin._7_1_) && (begin._7_1_ < ':')) {
            index = lVar3;
            bVar1 = parse_integer<char,long>((char **)&arg_index_local,&width);
            if ((bVar1) && (*(char *)arg_index_local == '$')) {
              __return_storage_ptr__->value_index = width + -1;
              begin._7_1_ = *(char *)(arg_index_local + 1);
              arg_index_local = arg_index_local + 1;
            }
            else {
              arg_index_local = index;
              begin._7_1_ = *(char *)index;
            }
          }
          while( true ) {
            bVar1 = true;
            if ((((begin._7_1_ != '\'') && (bVar1 = true, begin._7_1_ != '-')) &&
                (bVar1 = true, begin._7_1_ != '0')) &&
               ((bVar1 = true, begin._7_1_ != '+' && (bVar1 = true, begin._7_1_ != ' ')))) {
              bVar1 = begin._7_1_ == '#';
            }
            if (!bVar1) break;
            switch(begin._7_1_) {
            case ' ':
              __return_storage_ptr__->flags = __return_storage_ptr__->flags | 0x20;
              break;
            case '#':
              __return_storage_ptr__->flags = __return_storage_ptr__->flags | 0x1000;
              _Var2 = std::operator|(_S_showbase,_S_showpoint);
              std::operator|=(&__return_storage_ptr__->fmtflags,_Var2);
              break;
            case '\'':
              __return_storage_ptr__->flags = __return_storage_ptr__->flags | 0x2000;
              break;
            case '+':
              __return_storage_ptr__->flags = __return_storage_ptr__->flags | 0x40;
              std::operator|=(&__return_storage_ptr__->fmtflags,_S_showpos);
              break;
            case '-':
              __return_storage_ptr__->flags = __return_storage_ptr__->flags | 0x800;
              std::operator|=(&__return_storage_ptr__->fmtflags,_S_left);
              break;
            case '0':
              __return_storage_ptr__->flags = __return_storage_ptr__->flags | 0x400;
            }
            begin._7_1_ = *(char *)(arg_index_local + 1);
            arg_index_local = arg_index_local + 1;
          }
          if (((__return_storage_ptr__->flags & 0x800) != 0) &&
             ((__return_storage_ptr__->flags & 0x400) != 0)) {
            __return_storage_ptr__->flags = __return_storage_ptr__->flags & 0xfbff;
          }
          if (((__return_storage_ptr__->flags & 0x40) != 0) &&
             ((__return_storage_ptr__->flags & 0x20) != 0)) {
            __return_storage_ptr__->flags = __return_storage_ptr__->flags & 0xffdf;
          }
          index_1 = 0;
          if (begin._7_1_ == '*') {
            __return_storage_ptr__->flags = __return_storage_ptr__->flags | 0x80;
            begin._7_1_ = *(char *)(arg_index_local + 1);
            if ((begin._7_1_ < '1') || ('9' < begin._7_1_)) {
              __return_storage_ptr__->width_index =
                   iStack_18 + (ulong)__return_storage_ptr__->nof_args;
              arg_index_local = arg_index_local + 1;
            }
            else {
              arg_index_local = arg_index_local + 1;
              bVar1 = parse_integer<char,long>((char **)&arg_index_local,&precision);
              if (!bVar1) {
                return __return_storage_ptr__;
              }
              if (*(char *)arg_index_local != '$') {
                return __return_storage_ptr__;
              }
              begin._7_1_ = *(char *)(arg_index_local + 1);
              __return_storage_ptr__->width_index = precision + -1;
              arg_index_local = arg_index_local + 1;
            }
            __return_storage_ptr__->nof_args = __return_storage_ptr__->nof_args + 1;
          }
          else {
            bVar1 = parse_integer<char,long>((char **)&arg_index_local,&index_1);
            if (!bVar1) {
              return __return_storage_ptr__;
            }
            begin._7_1_ = *(char *)arg_index_local;
            __return_storage_ptr__->width = index_1;
          }
          if (begin._7_1_ == '.') {
            __return_storage_ptr__->flags = __return_storage_ptr__->flags | 0x100;
            lVar3 = arg_index_local + 1;
            begin._7_1_ = *(char *)(arg_index_local + 1);
            index_2 = 0;
            if (begin._7_1_ == '*') {
              __return_storage_ptr__->flags = __return_storage_ptr__->flags | 0x200;
              begin._7_1_ = *(char *)(arg_index_local + 2);
              if ((begin._7_1_ < '1') || ('9' < begin._7_1_)) {
                __return_storage_ptr__->precision_index =
                     iStack_18 + (ulong)__return_storage_ptr__->nof_args;
                arg_index_local = arg_index_local + 2;
              }
              else {
                arg_index_local = arg_index_local + 2;
                bVar1 = parse_integer<char,long>((char **)&arg_index_local,&local_50);
                if (!bVar1) {
                  return __return_storage_ptr__;
                }
                if (*(char *)arg_index_local != '$') {
                  return __return_storage_ptr__;
                }
                begin._7_1_ = *(char *)(arg_index_local + 1);
                __return_storage_ptr__->precision_index = local_50 + -1;
                arg_index_local = arg_index_local + 1;
              }
              __return_storage_ptr__->nof_args = __return_storage_ptr__->nof_args + 1;
            }
            else {
              arg_index_local = lVar3;
              if (('/' < begin._7_1_) && (begin._7_1_ < ':')) {
                bVar1 = parse_integer<char,long>((char **)&arg_index_local,&index_2);
                if (!bVar1) {
                  return __return_storage_ptr__;
                }
                begin._7_1_ = *(char *)arg_index_local;
              }
              __return_storage_ptr__->precision = index_2;
            }
            if ((__return_storage_ptr__->flags & 0x400) != 0) {
              __return_storage_ptr__->flags = __return_storage_ptr__->flags & 0xfbff;
            }
          }
          while( true ) {
            bVar1 = true;
            if ((((begin._7_1_ != 'l') && (bVar1 = true, begin._7_1_ != 'L')) &&
                (bVar1 = true, begin._7_1_ != 'h')) &&
               ((bVar1 = true, begin._7_1_ != 'j' && (bVar1 = true, begin._7_1_ != 'z')))) {
              bVar1 = begin._7_1_ == 't';
            }
            if (!bVar1) break;
            begin._7_1_ = *(char *)(arg_index_local + 1);
            arg_index_local = arg_index_local + 1;
          }
          __return_storage_ptr__->conversion = begin._7_1_;
          switch(begin._7_1_) {
          case 'A':
            _Var2 = std::operator|(_S_scientific,_S_fixed);
            _Var2 = std::operator|(_Var2,_S_uppercase);
            std::operator|=(&__return_storage_ptr__->fmtflags,_Var2);
            __return_storage_ptr__->flags = __return_storage_ptr__->flags | 0x10;
            __return_storage_ptr__->base = 0x10;
            break;
          default:
            return __return_storage_ptr__;
          case 'C':
          case 'c':
            __return_storage_ptr__->flags = __return_storage_ptr__->flags | 2;
            break;
          case 'E':
            _Var2 = std::operator|(_S_scientific,_S_uppercase);
            std::operator|=(&__return_storage_ptr__->fmtflags,_Var2);
            __return_storage_ptr__->flags = __return_storage_ptr__->flags | 0x10;
            __return_storage_ptr__->base = 10;
            break;
          case 'F':
            _Var2 = std::operator|(_S_fixed,_S_uppercase);
            std::operator|=(&__return_storage_ptr__->fmtflags,_Var2);
            __return_storage_ptr__->flags = __return_storage_ptr__->flags | 0x10;
            __return_storage_ptr__->base = 10;
            break;
          case 'G':
            std::operator|=(&__return_storage_ptr__->fmtflags,_S_uppercase);
            __return_storage_ptr__->flags = __return_storage_ptr__->flags | 0x10;
            __return_storage_ptr__->base = 10;
            break;
          case 'S':
          case 's':
            std::operator|=(&__return_storage_ptr__->fmtflags,_S_boolalpha);
            break;
          case 'X':
            std::operator|=(&__return_storage_ptr__->fmtflags,_S_uppercase);
            __return_storage_ptr__->flags = __return_storage_ptr__->flags | 4;
            __return_storage_ptr__->base = 0x10;
            break;
          case 'a':
            _Var2 = std::operator|(_S_scientific,_S_fixed);
            std::operator|=(&__return_storage_ptr__->fmtflags,_Var2);
            __return_storage_ptr__->base = 0x10;
            break;
          case 'e':
            std::operator|=(&__return_storage_ptr__->fmtflags,_S_scientific);
            __return_storage_ptr__->base = 10;
            break;
          case 'f':
            std::operator|=(&__return_storage_ptr__->fmtflags,_S_fixed);
            __return_storage_ptr__->base = 10;
            break;
          case 'g':
            __return_storage_ptr__->base = 10;
            break;
          case 'n':
            break;
          case 'o':
            __return_storage_ptr__->flags = __return_storage_ptr__->flags | 4;
            __return_storage_ptr__->base = 8;
            break;
          case 'p':
            __return_storage_ptr__->base = 0x10;
            __return_storage_ptr__->flags = __return_storage_ptr__->flags | 1;
            break;
          case 'u':
            __return_storage_ptr__->flags = __return_storage_ptr__->flags | 8;
          case 'd':
          case 'i':
            __return_storage_ptr__->flags = __return_storage_ptr__->flags | 4;
            __return_storage_ptr__->base = 10;
            break;
          case 'x':
            __return_storage_ptr__->flags = __return_storage_ptr__->flags | 4;
            __return_storage_ptr__->base = 0x10;
          }
          if (((__return_storage_ptr__->flags & 0x2000) != 0) &&
             (__return_storage_ptr__->base != 10)) {
            __return_storage_ptr__->flags = __return_storage_ptr__->flags & 0xdfff;
          }
          __return_storage_ptr__->valid = true;
          if (__return_storage_ptr__->value_index < 0) {
            __return_storage_ptr__->value_index =
                 iStack_18 + (ulong)__return_storage_ptr__->nof_args;
          }
          __return_storage_ptr__->nof_args = __return_storage_ptr__->nof_args + 1;
          if (*(char *)(arg_index_local + 1) != '\0') {
            __return_storage_ptr__->nextp = (char *)(arg_index_local + 1);
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline format_segment<CharT>
parse_format_segment(const CharT* format, integer arg_index) {
   format_segment<CharT> result;
   if (!format) return result;

   /* skip everything until we encounter a placeholder
      or the end of the format string */
   result.beginp = format;
   CharT ch = *format;
   while (ch && ch != '%') {
      ch = *++format;
   }
   result.endp = format;

   /* end of format string reached? */
   if (!ch) {
      result.valid = true;
      return result;
   }

   ch = *++format;
   if (!ch) return result; /* format ends with '%' */

   /* process %% */
   if (ch == '%') {
      result.valid = true;
      ++result.endp; /* include first '%' */
      result.nextp = format+1;
      return result;
   }

   /* check if we have an argument index */
   if (ch >= '1' && ch <= '9') {
      const CharT* begin = format;
      integer index;
      if (parse_integer(format, index) && *format == '$') {
	 /* accept argument index */
	 result.value_index = index - 1;
	 ch = *++format;
      } else {
	 /* reset parsing */
	 format = begin; ch = *format;
      }
   }

   /* process conversion flags */
   while (ch == '\'' || ch == '-' || ch == '0' || ch == '+' ||
	 ch == ' ' || ch == '#') {
      switch (ch) {
	 case '\'':
	    result.flags |= grouping_flag;
	    break;
	 case '-':
	    result.flags |= minus_flag;
	    result.fmtflags |= std::ios_base::left;
	    break;
	 case '0': result.flags |= zero_fill; break;
	 case '+':
	    result.flags |= plus_flag;
	    result.fmtflags |= std::ios_base::showpos;
	    break;
	 case ' ': result.flags |= space_flag; break;
	 case '#':
	    result.flags |= special_flag;
	    result.fmtflags |= (std::ios_base::showbase |
	       std::ios_base::showpoint);
	    break;
      }
      ch = *++format;
   }

   if ((result.flags & minus_flag) && (result.flags & zero_fill)) {
      /* if the 0 and - flags both appear, the 0 flag is ignored */
      result.flags &= ~zero_fill;
   }
   if ((result.flags & plus_flag) && (result.flags & space_flag)) {
      /* if the ' ' and '+' flags both appear,
	 the <space> flag shall be ignored */
      result.flags &= ~space_flag;
   }
   /* minimum field width */
   std::streamsize width = 0;
   if (ch == '*') {
      result.flags |= dyn_width; ch = *++format;
      if (ch >= '1' && ch <= '9') {
	 integer index;
	 if (!parse_integer(format, index) || *format != '$') return result;
	 ch = *++format;
	 result.width_index = index - 1;
      } else {
	 result.width_index = arg_index + result.nof_args;
      }
      result.nof_args++;
   } else {
      if (!parse_integer(format, width)) return result;
      ch = *format;
      result.width = width;
   }
   /* precision */
   if (ch == '.') {
      result.flags |= precision;
      ch = *++format;
      std::streamsize precision = 0;
      if (ch == '*') {
	 result.flags |= dyn_precision; ch = *++format;
	 if (ch >= '1' && ch <= '9') {
	    integer index;
	    if (!parse_integer(format, index) || *format != '$') return result;
	    ch = *++format;
	    result.precision_index = index - 1;
	 } else {
	    result.precision_index = arg_index + result.nof_args;
	 }
	 result.nof_args++;
      } else {
	 if (ch >= '0' && ch <= '9') {
	    if (!parse_integer(format, precision)) return result;
	    ch = *format;
	 }
	 result.precision = precision;
      }
      if (result.flags & zero_fill) {
	 /* if a precision is specified, the 0 flag is ignored */
	 result.flags &= ~zero_fill;
      }
   }
   /* skip size specification */
   while (ch == 'l' || ch == 'L' || ch == 'h' ||
	 ch == 'j' || ch == 'z' || ch == 't') {
      ch = *++format;
   }
   /* conversion operation */
   result.conversion = ch;
   switch (ch) {
      case 'u':
	 result.flags |= is_unsigned;
	 FMT_PRINTF_FALLTHROUGH
      case 'd':
      case 'i':
	 result.flags |= is_integer;
	 result.base = 10;
	 break;
      case 'o':
	 result.flags |= is_integer;
	 result.base = 8;
	 break;
      case 'x':
	 result.flags |= is_integer;
	 result.base = 16;
	 break;
      case 'X':
	 result.fmtflags |= std::ios_base::uppercase;
	 result.flags |= is_integer;
	 result.base = 16;
	 break;
      case 'f':
	 result.fmtflags |= std::ios_base::fixed;
	 result.base = 10;
	 break;
      case 'F':
	 result.fmtflags |= (std::ios_base::fixed | std::ios_base::uppercase);
	 result.flags |= toupper;
	 result.base = 10;
	 break;
      case 'e':
	 result.fmtflags |= std::ios_base::scientific;
	 result.base = 10;
	 break;
      case 'E':
	 result.fmtflags |=
	    std::ios_base::scientific | std::ios_base::uppercase;
	 result.flags |= toupper;
	 result.base = 10;
	 break;
      case 'g':
	 /* default behaviour */
	 result.base = 10;
	 break;
      case 'G':
	 result.fmtflags |= std::ios_base::uppercase;
	 result.flags |= toupper;
	 result.base = 10;
	 break;
      case 'a':
	 result.fmtflags |= std::ios_base::scientific | std::ios_base::fixed;
	 result.base = 16;
	 break;
      case 'A':
	 result.fmtflags |= std::ios_base::scientific |
	    std::ios_base::fixed | std::ios_base::uppercase;
	 result.flags |= toupper;
	 result.base = 16;
	 break;
      case 'p':
	 result.base = 16;
	 result.flags |= is_pointer;
	 break;
      case 'C':
	 /* POSIX extension, equivalent to 'lc' */
      case 'c':
	 result.flags |= is_charval;
	 break;
      case 'S':
	 /* POSIX extension, equivalent to 'ls' */
      case 's':
	 /* when boolean values are printed with %s, we get
	    more readable results; idea taken from N3506 */
	 result.fmtflags |= std::ios_base::boolalpha;
	 break;
      case 'n':
	 /* nothing to be done here */
	 break;
      default:
	 return result;
   }
   if ((result.flags & grouping_flag) && (result.base != 10)) {
      /* grouping is just supported for %i, %d, %u, %f, %F,
         %g, and %G, i.e. all cases with base == 10 */
      result.flags &= ~grouping_flag;
   }
   result.valid = true;
   if (result.value_index < 0) {
      result.value_index = arg_index + result.nof_args;
   }
   result.nof_args++;
   ch = *++format;
   if (ch) {
      result.nextp = format;
   }
   return result;
}